

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O1

Result __thiscall
wabt::anon_unknown_67::BinaryReaderIR::OnBlockExpr(BinaryReaderIR *this,Type sig_type)

{
  Result RVar1;
  pointer __p;
  __uniq_ptr_data<wabt::BlockExprBase<(wabt::ExprType)7>,_std::default_delete<wabt::BlockExprBase<(wabt::ExprType)7>_>,_true,_true>
  local_38;
  unique_ptr<wabt::BlockExprBase<(wabt::ExprType)7>,_std::default_delete<wabt::BlockExprBase<(wabt::ExprType)7>_>_>
  expr;
  
  MakeUnique<wabt::BlockExprBase<(wabt::ExprType)7>>();
  SetBlockDeclaration(this,(BlockDeclaration *)
                           ((long)local_38.
                                  super___uniq_ptr_impl<wabt::BlockExprBase<(wabt::ExprType)7>,_std::default_delete<wabt::BlockExprBase<(wabt::ExprType)7>_>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_wabt::BlockExprBase<(wabt::ExprType)7>_*,_std::default_delete<wabt::BlockExprBase<(wabt::ExprType)7>_>_>
                                  .
                                  super__Head_base<0UL,_wabt::BlockExprBase<(wabt::ExprType)7>_*,_false>
                                  ._M_head_impl + 0x60),sig_type);
  expr._M_t.
  super___uniq_ptr_impl<wabt::BlockExprBase<(wabt::ExprType)7>,_std::default_delete<wabt::BlockExprBase<(wabt::ExprType)7>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_wabt::BlockExprBase<(wabt::ExprType)7>_*,_std::default_delete<wabt::BlockExprBase<(wabt::ExprType)7>_>_>
  .super__Head_base<0UL,_wabt::BlockExprBase<(wabt::ExprType)7>_*,_false>._M_head_impl =
       (__uniq_ptr_data<wabt::BlockExprBase<(wabt::ExprType)7>,_std::default_delete<wabt::BlockExprBase<(wabt::ExprType)7>_>,_true,_true>
        )(__uniq_ptr_data<wabt::BlockExprBase<(wabt::ExprType)7>,_std::default_delete<wabt::BlockExprBase<(wabt::ExprType)7>_>,_true,_true>
          )local_38.
           super___uniq_ptr_impl<wabt::BlockExprBase<(wabt::ExprType)7>,_std::default_delete<wabt::BlockExprBase<(wabt::ExprType)7>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_wabt::BlockExprBase<(wabt::ExprType)7>_*,_std::default_delete<wabt::BlockExprBase<(wabt::ExprType)7>_>_>
           .super__Head_base<0UL,_wabt::BlockExprBase<(wabt::ExprType)7>_*,_false>._M_head_impl;
  RVar1 = AppendExpr(this,(unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)&expr);
  if ((__uniq_ptr_impl<wabt::BlockExprBase<(wabt::ExprType)7>,_std::default_delete<wabt::BlockExprBase<(wabt::ExprType)7>_>_>
       )expr._M_t.
        super___uniq_ptr_impl<wabt::BlockExprBase<(wabt::ExprType)7>,_std::default_delete<wabt::BlockExprBase<(wabt::ExprType)7>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_wabt::BlockExprBase<(wabt::ExprType)7>_*,_std::default_delete<wabt::BlockExprBase<(wabt::ExprType)7>_>_>
        .super__Head_base<0UL,_wabt::BlockExprBase<(wabt::ExprType)7>_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<wabt::BlockExprBase<(wabt::ExprType)7>,_std::default_delete<wabt::BlockExprBase<(wabt::ExprType)7>_>_>
       )0x0) {
    (**(code **)(*(long *)expr._M_t.
                          super___uniq_ptr_impl<wabt::BlockExprBase<(wabt::ExprType)7>,_std::default_delete<wabt::BlockExprBase<(wabt::ExprType)7>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_wabt::BlockExprBase<(wabt::ExprType)7>_*,_std::default_delete<wabt::BlockExprBase<(wabt::ExprType)7>_>_>
                          .super__Head_base<0UL,_wabt::BlockExprBase<(wabt::ExprType)7>_*,_false>.
                          _M_head_impl + 8))();
  }
  expr._M_t.
  super___uniq_ptr_impl<wabt::BlockExprBase<(wabt::ExprType)7>,_std::default_delete<wabt::BlockExprBase<(wabt::ExprType)7>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_wabt::BlockExprBase<(wabt::ExprType)7>_*,_std::default_delete<wabt::BlockExprBase<(wabt::ExprType)7>_>_>
  .super__Head_base<0UL,_wabt::BlockExprBase<(wabt::ExprType)7>_*,_false>._M_head_impl =
       (__uniq_ptr_data<wabt::BlockExprBase<(wabt::ExprType)7>,_std::default_delete<wabt::BlockExprBase<(wabt::ExprType)7>_>,_true,_true>
        )(__uniq_ptr_impl<wabt::BlockExprBase<(wabt::ExprType)7>,_std::default_delete<wabt::BlockExprBase<(wabt::ExprType)7>_>_>
          )0x0;
  if (RVar1.enum_ != Error) {
    PushLabel(this,Block,
              (ExprList *)
              ((long)local_38.
                     super___uniq_ptr_impl<wabt::BlockExprBase<(wabt::ExprType)7>,_std::default_delete<wabt::BlockExprBase<(wabt::ExprType)7>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_wabt::BlockExprBase<(wabt::ExprType)7>_*,_std::default_delete<wabt::BlockExprBase<(wabt::ExprType)7>_>_>
                     .super__Head_base<0UL,_wabt::BlockExprBase<(wabt::ExprType)7>_*,_false>.
                     _M_head_impl + 0xe0),(Expr *)0x0);
  }
  return (Result)(uint)(RVar1.enum_ == Error);
}

Assistant:

Result BinaryReaderIR::OnBlockExpr(Type sig_type) {
  auto expr = MakeUnique<BlockExpr>();
  SetBlockDeclaration(&expr->block.decl, sig_type);
  ExprList* expr_list = &expr->block.exprs;
  CHECK_RESULT(AppendExpr(std::move(expr)));
  PushLabel(LabelType::Block, expr_list);
  return Result::Ok;
}